

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O1

XmlNodePtr __thiscall libcellml::XmlNode::next(XmlNode *this)

{
  void *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  XmlNode XVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined8 *in_RSI;
  XmlNode *__tmp;
  XmlNodePtr XVar4;
  undefined1 local_29;
  XmlNode local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  pvVar1 = *(void **)(*(long *)*in_RSI + 0x30);
  this->mPimpl = (XmlNodeImpl *)0x0;
  this[1].mPimpl = (XmlNodeImpl *)0x0;
  if (pvVar1 != (void *)0x0) {
    local_28.mPimpl = (XmlNodeImpl *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libcellml::XmlNode,std::allocator<libcellml::XmlNode>>
              (&_Stack_20,(XmlNode **)&local_28,(allocator<libcellml::XmlNode> *)&local_29);
    _Var3._M_pi = _Stack_20._M_pi;
    XVar2.mPimpl = local_28.mPimpl;
    local_28.mPimpl = (XmlNodeImpl *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->mPimpl = (XmlNodeImpl *)XVar2;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this[1].mPimpl;
    this[1].mPimpl = (XmlNodeImpl *)_Var3._M_pi;
    in_RDX._M_pi = extraout_RDX;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RDX._M_pi = extraout_RDX_00;
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
      in_RDX._M_pi = extraout_RDX_01;
    }
    (XVar2.mPimpl)->mXmlNodePtr->_private = pvVar1;
  }
  XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (XmlNodePtr)XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlNode::next() const
{
    xmlNodePtr next = mPimpl->mXmlNodePtr->next;
    XmlNodePtr nextHandle = nullptr;
    if (next != nullptr) {
        nextHandle = std::make_shared<XmlNode>();
        nextHandle->setXmlNode(next);
    }
    return nextHandle;
}